

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_generators.cpp
# Opt level: O0

Vector3d * opengv::generateRandomPoint(double maximumDepth,double minimumDepth)

{
  int iVar1;
  Scalar *pSVar2;
  Vector3d *in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  Vector3d direction;
  Vector3d *cleanPoint;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *in_stack_fffffffffffffed0;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *this_00;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_stack_fffffffffffffef0;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_stack_fffffffffffffef8;
  StorageBaseType *in_stack_ffffffffffffff10;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_ffffffffffffff18;
  double *scalar;
  
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x1303ee3);
  iVar1 = rand();
  this = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
         (((double)iVar1 / 2147483647.0 - 0.5) * 2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (in_stack_fffffffffffffed0,(Index)this);
  *pSVar2 = (Scalar)this;
  iVar1 = rand();
  this_00 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
            (((double)iVar1 / 2147483647.0 - 0.5) * 2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (this_00,(Index)this);
  *pSVar2 = (Scalar)this_00;
  iVar1 = rand();
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (this_00,(Index)this);
  *pSVar2 = ((double)iVar1 / 2147483647.0 - 0.5) * 2.0;
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm(this);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/
            (in_stack_ffffffffffffff18,(double *)in_stack_ffffffffffffff10);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)this_00,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)this);
  scalar = (double *)(in_XMM0_Qa - in_XMM1_Qa);
  Eigen::operator*(scalar,in_stack_ffffffffffffff10);
  Eigen::operator*(scalar,in_stack_ffffffffffffff10);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
  ::operator+(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)this_00,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)this);
  return in_RDI;
}

Assistant:

Eigen::Vector3d
opengv::generateRandomPoint( double maximumDepth, double minimumDepth )
{
  Eigen::Vector3d cleanPoint;
  cleanPoint[0] = (((double) rand())/ ((double) RAND_MAX)-0.5)*2.0;
  cleanPoint[1] = (((double) rand())/ ((double) RAND_MAX)-0.5)*2.0;
  cleanPoint[2] = (((double) rand())/ ((double) RAND_MAX)-0.5)*2.0;
  Eigen::Vector3d direction = cleanPoint / cleanPoint.norm();
  cleanPoint =
      (maximumDepth-minimumDepth) * cleanPoint + minimumDepth * direction;
  return cleanPoint;
}